

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spaceusage.c
# Opt level: O0

int main(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 uVar9;
  undefined4 uVar15;
  double dVar10;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  sizes sVar16;
  sizes sVar17;
  sizes sVar18;
  sizes x8;
  sizes x16;
  sizes f8;
  sizes f16;
  size_t n;
  double in_stack_ffffffffffffffa0;
  size_t n_00;
  sizes local_50;
  size_t sStack_48;
  size_t local_40;
  size_t local_38;
  size_t local_30;
  size_t local_28;
  size_t local_20;
  size_t local_18;
  ulong local_10;
  undefined1 auVar11 [16];
  
  for (local_10 = 10; local_10 < 0x989681; local_10 = local_10 << 1) {
    printf("%-10zu ",local_10);
    sVar16 = fuse16(n_00);
    sVar17 = fuse8(n_00);
    sVar18 = xor16((size_t)in_stack_ffffffffffffffa0);
    local_50 = xor8((size_t)in_stack_ffffffffffffffa0);
    local_20 = sVar16.standard;
    auVar1._8_4_ = sVar16.standard._4_4_;
    auVar1._0_8_ = local_20;
    auVar1._12_4_ = 0x45300000;
    in_stack_ffffffffffffffa0 = 1.9342813113834067e+25;
    uVar15 = (undefined4)(local_10 >> 0x20);
    auVar11._8_4_ = uVar15;
    auVar11._0_8_ = local_10;
    auVar11._12_4_ = 0x45300000;
    uVar9 = (undefined4)local_10;
    dVar10 = (auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar9) - 4503599627370496.0);
    local_18 = sVar16.pack;
    auVar5._8_4_ = sVar16.pack._4_4_;
    auVar5._0_8_ = local_18;
    auVar5._12_4_ = 0x45300000;
    printf("fuse16: %5.2f %5.2f   ",
           (((auVar1._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar16.standard) - 4503599627370496.0)) * 8.0) /
           dVar10,(((auVar5._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar16.pack) - 4503599627370496.0)) * 8.0) /
                  dVar10);
    local_30 = sVar17.standard;
    auVar2._8_4_ = sVar17.standard._4_4_;
    auVar2._0_8_ = local_30;
    auVar2._12_4_ = 0x45300000;
    auVar12._8_4_ = uVar15;
    auVar12._0_8_ = local_10;
    auVar12._12_4_ = 0x45300000;
    dVar10 = (auVar12._8_8_ - in_stack_ffffffffffffffa0) +
             ((double)CONCAT44(0x43300000,uVar9) - 4503599627370496.0);
    local_28 = sVar17.pack;
    auVar6._8_4_ = sVar17.pack._4_4_;
    auVar6._0_8_ = local_28;
    auVar6._12_4_ = 0x45300000;
    printf("fuse8: %5.2f %5.2f   ",
           (((auVar2._8_8_ - in_stack_ffffffffffffffa0) +
            ((double)CONCAT44(0x43300000,(int)sVar17.standard) - 4503599627370496.0)) * 8.0) /
           dVar10,(((auVar6._8_8_ - in_stack_ffffffffffffffa0) +
                   ((double)CONCAT44(0x43300000,(int)sVar17.pack) - 4503599627370496.0)) * 8.0) /
                  dVar10);
    local_40 = sVar18.standard;
    auVar3._8_4_ = sVar18.standard._4_4_;
    auVar3._0_8_ = local_40;
    auVar3._12_4_ = 0x45300000;
    auVar13._8_4_ = uVar15;
    auVar13._0_8_ = local_10;
    auVar13._12_4_ = 0x45300000;
    dVar10 = (auVar13._8_8_ - in_stack_ffffffffffffffa0) +
             ((double)CONCAT44(0x43300000,uVar9) - 4503599627370496.0);
    local_38 = sVar18.pack;
    auVar7._8_4_ = sVar18.pack._4_4_;
    auVar7._0_8_ = local_38;
    auVar7._12_4_ = 0x45300000;
    printf("xor16: %5.2f %5.2f   ",
           (((auVar3._8_8_ - in_stack_ffffffffffffffa0) +
            ((double)CONCAT44(0x43300000,(int)sVar18.standard) - 4503599627370496.0)) * 8.0) /
           dVar10,(((auVar7._8_8_ - in_stack_ffffffffffffffa0) +
                   ((double)CONCAT44(0x43300000,(int)sVar18.pack) - 4503599627370496.0)) * 8.0) /
                  dVar10);
    auVar4._8_4_ = local_50.standard._4_4_;
    auVar4._0_8_ = n_00;
    auVar4._12_4_ = 0x45300000;
    auVar14._8_4_ = uVar15;
    auVar14._0_8_ = local_10;
    auVar14._12_4_ = 0x45300000;
    dVar10 = (auVar14._8_8_ - in_stack_ffffffffffffffa0) +
             ((double)CONCAT44(0x43300000,uVar9) - 4503599627370496.0);
    auVar8._8_4_ = local_50.pack._4_4_;
    auVar8._0_8_ = sStack_48;
    auVar8._12_4_ = 0x45300000;
    printf("xor8: %5.2f %5.2f   ",
           (((auVar4._8_8_ - in_stack_ffffffffffffffa0) +
            ((double)CONCAT44(0x43300000,(int)local_50.standard) - 4503599627370496.0)) * 8.0) /
           dVar10,(((auVar8._8_8_ - in_stack_ffffffffffffffa0) +
                   ((double)CONCAT44(0x43300000,(int)local_50.pack) - 4503599627370496.0)) * 8.0) /
                  dVar10);
    printf("\n");
  }
  return 0;
}

Assistant:

int main() {
    for (size_t n = 10; n <= 10000000; n *= 2) {
        printf("%-10zu ", n);  // Align number to 10 characters wide
        sizes f16 = fuse16(n);
        sizes f8 = fuse8(n);
        sizes x16 = xor16(n);
        sizes x8 = xor8(n);
        
        printf("fuse16: %5.2f %5.2f   ", (double)f16.standard * 8.0 / n, (double)f16.pack * 8.0 / n);
        printf("fuse8: %5.2f %5.2f   ", (double)f8.standard  * 8.0 / n, (double)f8.pack  * 8.0 / n);
        printf("xor16: %5.2f %5.2f   ", (double)x16.standard  * 8.0 / n, (double)x16.pack  * 8.0 / n);
        printf("xor8: %5.2f %5.2f   ", (double)x8.standard  * 8.0 / n, (double)x8.pack  * 8.0 / n);
        printf("\n");
    }
    return EXIT_SUCCESS;
}